

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O3

int __thiscall QFile::rename(QFile *this,char *__old,char *__new)

{
  QString *filePath;
  QFilePrivate *this_00;
  long lVar1;
  _Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_> _Var2;
  int *piVar3;
  qsizetype qVar4;
  qsizetype qVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  undefined8 uVar8;
  bool bVar9;
  char cVar10;
  int iVar11;
  uint uVar12;
  FileError FVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  EVP_PKEY_CTX *src_00;
  QFile *__new_00;
  char *__filename;
  QArrayData *__old_00;
  int iVar14;
  undefined7 uVar15;
  QFileSystemEntry *this_01;
  long in_FS_OFFSET;
  QStringView rhs;
  QAnyStringView a;
  QAnyStringView a_00;
  QAnyStringView a_01;
  QStringView lhs;
  QFileSystemEntry tmp;
  QFileSystemEntry src;
  QString local_248;
  QString local_230;
  QString local_218;
  QString local_200;
  type local_1e8;
  QString local_1c8;
  QString local_1b0;
  QString local_198;
  QString local_180;
  QSystemError local_168;
  QSystemError local_160;
  QTemporaryFileName local_158;
  QByteArray local_128;
  QByteArray local_108;
  QFileSystemEntry local_f0;
  undefined1 local_b8 [64];
  undefined1 local_78 [64];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QFilePrivate *)(this->super_QFileDevice).super_QIODevice.super_QObject.d_ptr.d;
  __old_00 = (QArrayData *)local_78;
  __new_00 = this;
  (*(this->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0x1d])();
  uVar8 = local_78._16_8_;
  if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      __new_00 = (QFile *)0x2;
      __old_00 = (QArrayData *)local_78._0_8_;
      QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
    }
  }
  if ((undefined1 *)uVar8 == (undefined1 *)0x0) {
    rename((char *)__old_00,(char *)__new_00);
  }
  else {
    lVar1 = (this_00->fileName).d.size;
    if ((lVar1 == *(long *)(__old + 0x10)) &&
       (rhs.m_data = *(storage_type_conflict **)(__old + 8), rhs.m_size = lVar1,
       lhs.m_data = (this_00->fileName).d.ptr, lhs.m_size = lVar1,
       bVar9 = QtPrivate::equalStrings(lhs,rhs), bVar9)) {
      QMetaObject::tr((QString *)local_78,&staticMetaObject,"Destination file is the same file.",
                      (char *)0x0,-1);
      QFileDevicePrivate::setError((QFileDevicePrivate *)this_00,RenameError,(QString *)local_78);
    }
    else {
      iVar11 = (*((this->super_QFileDevice).super_QIODevice.super_QObject.d_ptr.d)->
                 _vptr_QObjectData[7])();
      uVar12 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar11) + 0xb0))
                         ((long *)CONCAT44(extraout_var,iVar11),0xff00000);
      if ((uVar12 >> 0x16 & 1) != 0) {
        local_108.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_108.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_108.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        this_01 = (QFileSystemEntry *)local_78;
        QFileSystemEntry::QFileSystemEntry(this_01,(QString *)__old);
        QFileSystemEngine::id(&local_108,this_01);
        if ((QArrayData *)local_78._24_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_78._24_8_,1,0x10);
          }
        }
        if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
          }
        }
        filePath = &this_00->fileName;
        bVar9 = QByteArray::isNull(&local_108);
        if (bVar9) {
          QFileDevice::unsetError(&this->super_QFileDevice);
          (*(this->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0xe])(this);
          FVar13 = QFileDevice::error(&this->super_QFileDevice);
          if (FVar13 == NoError) {
            iVar11 = (*(this_00->super_QFileDevicePrivate).super_QIODevicePrivate.
                       super_QObjectPrivate.super_QObjectData._vptr_QObjectData[7])(this_00);
            cVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar11) + 0x60))
                               ((long *)CONCAT44(extraout_var_00,iVar11),__old);
            uVar15 = (undefined7)((ulong)this_01 >> 8);
            if (cVar10 != '\0') {
              QFileDevice::unsetError(&this->super_QFileDevice);
              _Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl =
                   (this_00->super_QFileDevicePrivate).fileEngine._M_t.
                   super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
                   .super__Head_base<0UL,_QAbstractFileEngine_*,_false>;
              (**(code **)(*(long *)_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>.
                                    _M_head_impl + 0xf0))
                        (_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl,
                         __old);
              QString::operator=(filePath,(QString *)__old);
              uVar12 = (uint)CONCAT71(uVar15,1);
              goto LAB_00234934;
            }
            iVar11 = (*(this->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0xc])
                               (this);
            if ((char)iVar11 == '\0') {
              __filename = __old;
              iVar11 = QFilePrivate::copy(this_00,(EVP_PKEY_CTX *)__old,src_00);
              if ((char)iVar11 != '\0') {
                iVar11 = remove(this,__filename);
                if ((char)iVar11 == '\0') {
                  QMetaObject::tr((QString *)local_b8,&staticMetaObject,
                                  "Cannot remove source file: %1",(char *)0x0,-1);
                  QIODevice::errorString(&local_f0.m_filePath,(QIODevice *)this);
                  a_01.m_size = local_f0.m_filePath.d.size | 0x8000000000000000;
                  a_01.field_0.m_data_utf16 = local_f0.m_filePath.d.ptr;
                  QString::arg_impl((QString *)local_78,(QString *)local_b8,a_01,0,(QChar)0x20);
                  QFileDevicePrivate::setError
                            ((QFileDevicePrivate *)this_00,RenameError,(QString *)local_78);
                  if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
                    }
                  }
                  if (&(local_f0.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_f0.m_filePath.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_f0.m_filePath.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_f0.m_filePath.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_f0.m_filePath.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
                    }
                  }
                  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  QFile((QFile *)local_78,(QString *)__old);
                  QFileDevice::setPermissions((QFileDevice *)local_78,(Permissions)0x600);
                  remove(__old);
                  ~QFile((QFile *)local_78);
                  goto LAB_00234747;
                }
                _Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl =
                     (this_00->super_QFileDevicePrivate).fileEngine._M_t.
                     super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
                     .super__Head_base<0UL,_QAbstractFileEngine_*,_false>;
                (**(code **)(*(long *)_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>.
                                      _M_head_impl + 0xf0))
                          (_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl,
                           __old);
                QFileDevice::unsetError(&this->super_QFileDevice);
                uVar12 = (uint)CONCAT71(uVar15,1);
                setFileName(this,(QString *)__old);
                goto LAB_00234934;
              }
              QIODevice::errorString((QString *)local_78,(QIODevice *)this);
              QFileDevicePrivate::setError
                        ((QFileDevicePrivate *)this_00,RenameError,(QString *)local_78);
            }
            else {
              QMetaObject::tr((QString *)local_78,&staticMetaObject,
                              "Will not rename sequential file using block copy",(char *)0x0,-1);
              QFileDevicePrivate::setError
                        ((QFileDevicePrivate *)this_00,RenameError,(QString *)local_78);
            }
            if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
              }
            }
          }
LAB_00234747:
          uVar12 = 0;
        }
        else {
          local_128.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_128.d.d._0_4_ = 0xaaaaaaaa;
          local_128.d.d._4_4_ = 0xaaaaaaaa;
          local_128.d.ptr._0_4_ = 0xaaaaaaaa;
          local_128.d.ptr._4_4_ = 0xaaaaaaaa;
          _Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl =
               (this_00->super_QFileDevicePrivate).fileEngine._M_t.
               super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
               ._M_t.
               super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
               .super__Head_base<0UL,_QAbstractFileEngine_*,_false>;
          if (_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl ==
              (QAbstractFileEngine *)0x0) {
            QFileSystemEntry::QFileSystemEntry((QFileSystemEntry *)local_78,filePath);
            QFileSystemEngine::id(&local_128,(QFileSystemEntry *)local_78);
            if ((QArrayData *)local_78._24_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_78._24_8_,1,0x10);
              }
            }
            if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
              }
            }
          }
          else {
            (**(code **)(*(long *)_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>.
                                  _M_head_impl + 0xc0))(&local_128);
          }
          if ((local_128.d.size == local_108.d.size) &&
             ((((undefined1 *)local_108.d.size == (undefined1 *)0x0 ||
               (iVar11 = bcmp((void *)CONCAT44(local_128.d.ptr._4_4_,local_128.d.ptr._0_4_),
                              local_108.d.ptr,local_108.d.size), iVar11 == 0)) &&
              (iVar11 = QString::compare(filePath,(QString *)__old,CaseInsensitive), iVar11 == 0))))
          {
            local_158.length = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_158.path.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_158.pos = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_158.path.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_158.path.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
            QTemporaryFileName::QTemporaryFileName(&local_158,filePath);
            local_78._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_78._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_78._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_78._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            QFileSystemEntry::QFileSystemEntry((QFileSystemEntry *)local_78,filePath);
            local_160.errorCode = 0;
            local_160.errorScope = NoError;
            iVar11 = 0x10;
            do {
              local_b8._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_b8._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_b8._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_b8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_b8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              QTemporaryFileName::generateNext((NativePath *)&local_f0,&local_158);
              QFileSystemEntry::QFileSystemEntry((QFileSystemEntry *)local_b8,&local_f0);
              if (&(local_f0.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_f0.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                ._M_i = ((local_f0.m_filePath.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_f0.m_filePath.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&(local_f0.m_filePath.d.d)->super_QArrayData,1,0x10);
                }
              }
              bVar9 = QFileSystemEngine::renameFile
                                ((QFileSystemEntry *)local_78,(QFileSystemEntry *)local_b8,
                                 &local_160);
              iVar14 = 4;
              if (bVar9) {
                QFileSystemEntry::QFileSystemEntry(&local_f0,(QString *)__old);
                bVar9 = QFileSystemEngine::renameFile
                                  ((QFileSystemEntry *)local_b8,&local_f0,&local_160);
                piVar3 = (int *)CONCAT62(local_f0.m_nativeFilePath.d.d._2_6_,
                                         local_f0.m_nativeFilePath.d.d._0_2_);
                if (piVar3 != (int *)0x0) {
                  LOCK();
                  *piVar3 = *piVar3 + -1;
                  UNLOCK();
                  if (*piVar3 == 0) {
                    QArrayData::deallocate
                              ((QArrayData *)
                               CONCAT62(local_f0.m_nativeFilePath.d.d._2_6_,
                                        local_f0.m_nativeFilePath.d.d._0_2_),1,0x10);
                  }
                }
                if (&(local_f0.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_f0.m_filePath.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((local_f0.m_filePath.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_f0.m_filePath.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_f0.m_filePath.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (bVar9) {
                  _Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl =
                       (this_00->super_QFileDevicePrivate).fileEngine._M_t.
                       super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
                       .super__Head_base<0UL,_QAbstractFileEngine_*,_false>;
                  (**(code **)(*(long *)_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>.
                                        _M_head_impl + 0xf0))
                            (_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl,
                             __old);
                  QString::operator=(filePath,(QString *)__old);
                  this_01 = (QFileSystemEntry *)CONCAT71((int7)((ulong)this_01 >> 8),1);
                  iVar14 = 1;
                }
                else {
                  local_168.errorCode = 0;
                  local_168.errorScope = NoError;
                  bVar9 = QFileSystemEngine::renameFile
                                    ((QFileSystemEntry *)local_b8,(QFileSystemEntry *)local_78,
                                     &local_168);
                  iVar14 = 2;
                  if (!bVar9) {
                    QMetaObject::tr(&local_1b0,&staticMetaObject,"Error while renaming: %1",
                                    (char *)0x0,-1);
                    QSystemError::string(&local_1c8,local_160.errorScope,local_160.errorCode);
                    a.m_size = local_1c8.d.size | 0x8000000000000000;
                    a.field_0.m_data_utf16 = local_1c8.d.ptr;
                    QString::arg_impl(&local_198,&local_1b0,a,0,(QChar)0x20);
                    qVar5 = local_198.d.size;
                    pcVar7 = local_198.d.ptr;
                    pDVar6 = local_198.d.d;
                    local_198.d.d = (Data *)0x0;
                    local_198.d.ptr = (char16_t *)0x0;
                    local_198.d.size = 0;
                    QMetaObject::tr(&local_200,&staticMetaObject,"Unable to restore from %1: %2",
                                    (char *)0x0,-1);
                    QFileSystemEntry::filePath(&local_230,(QFileSystemEntry *)local_b8);
                    QDir::toNativeSeparators(&local_230);
                    QSystemError::string(&local_248,local_168.errorScope,local_168.errorCode);
                    QString::arg<QString,QString>(&local_1e8,&local_200,&local_218,&local_248);
                    qVar4 = local_1e8.d.size;
                    local_f0.m_nativeFilePath.d.size = (qsizetype)local_1e8.d.ptr;
                    local_f0.m_nativeFilePath.d.ptr = (char *)local_1e8.d.d;
                    local_f0.m_filePath.d.d = pDVar6;
                    local_f0.m_filePath.d.ptr = pcVar7;
                    local_f0.m_filePath.d.size = qVar5;
                    local_f0.m_nativeFilePath.d.d._0_2_ = 10;
                    local_1e8.d.d = (Data *)0x0;
                    local_1e8.d.ptr = (char16_t *)0x0;
                    local_1e8.d.size = 0;
                    qVar5 = local_1e8.d.size;
                    local_1e8.d.size._0_2_ = (undefined2)qVar4;
                    local_1e8.d.size._2_2_ = SUB82(qVar4,2);
                    local_1e8.d.size._4_2_ = SUB82(qVar4,4);
                    local_1e8.d.size._6_2_ = SUB82(qVar4,6);
                    local_f0.m_lastSeparator = (undefined2)local_1e8.d.size;
                    local_f0.m_firstDotInFileName = local_1e8.d.size._2_2_;
                    local_f0.m_lastDotInFileName = local_1e8.d.size._4_2_;
                    local_f0._54_2_ = local_1e8.d.size._6_2_;
                    local_1e8.d.size = qVar5;
                    QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::convertTo<QString>
                              (&local_180,
                               (QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *)
                               &local_f0);
                    QFileDevicePrivate::setError
                              ((QFileDevicePrivate *)this_00,RenameError,&local_180);
                    if (&(local_180.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_180.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_180.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_180.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_180.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::~QStringBuilder
                              ((QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *)
                               &local_f0);
                    if (&(local_1e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_1e8.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_1e8.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if (&(local_248.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_248.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_248.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_248.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_248.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if (&(local_218.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_218.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_218.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_218.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_218.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if (&(local_230.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_230.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_230.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_230.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_230.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if (&(local_200.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_200.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_200.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_200.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_200.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if (&(local_198.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_198.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_198.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_198.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_198.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if (&(local_1c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_1c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_1c8.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_1c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_1c8.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if (&(local_1b0.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_1b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_1b0.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_1b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_1b0.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    iVar14 = 1;
                    this_01 = (QFileSystemEntry *)0x0;
                  }
                }
              }
              uVar12 = (uint)this_01;
              if ((QArrayData *)local_b8._24_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_b8._24_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_b8._24_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_b8._24_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_b8._24_8_,1,0x10);
                }
              }
              if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
                }
              }
              if (iVar14 != 4) {
                if (iVar14 != 2) goto LAB_002350bb;
                break;
              }
              iVar11 = iVar11 + -1;
            } while (iVar11 != 0);
            QMetaObject::tr(&local_f0.m_filePath,&staticMetaObject,"Error while renaming: %1",
                            (char *)0x0,-1);
            QSystemError::string(&local_180,local_160.errorScope,local_160.errorCode);
            a_00.m_size = local_180.d.size | 0x8000000000000000;
            a_00.field_0.m_data_utf16 = local_180.d.ptr;
            QString::arg_impl((QString *)local_b8,&local_f0.m_filePath,a_00,0,(QChar)0x20);
            QFileDevicePrivate::setError
                      ((QFileDevicePrivate *)this_00,RenameError,(QString *)local_b8);
            if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
              }
            }
            if (&(local_180.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_180.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_180.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_180.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_180.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (&(local_f0.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_f0.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i = ((local_f0.m_filePath.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((local_f0.m_filePath.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&(local_f0.m_filePath.d.d)->super_QArrayData,2,0x10);
              }
            }
            uVar12 = 0;
LAB_002350bb:
            if ((QArrayData *)local_78._24_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_78._24_8_,1,0x10);
              }
            }
            if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
              }
            }
            if (&(local_158.path.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_158.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_158.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                   _M_i + -1;
              UNLOCK();
              if (((local_158.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                  _M_i == 0) {
                QArrayData::deallocate(&(local_158.path.d.d)->super_QArrayData,1,0x10);
              }
            }
          }
          else {
            QMetaObject::tr((QString *)local_78,&staticMetaObject,"Destination file exists",
                            (char *)0x0,-1);
            QFileDevicePrivate::setError
                      ((QFileDevicePrivate *)this_00,RenameError,(QString *)local_78);
            if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
              }
            }
            uVar12 = 0;
          }
          piVar3 = (int *)CONCAT44(local_128.d.d._4_4_,local_128.d.d._0_4_);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              QArrayData::deallocate
                        ((QArrayData *)CONCAT44(local_128.d.d._4_4_,local_128.d.d._0_4_),1,0x10);
            }
          }
        }
LAB_00234934:
        if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,1,0x10);
          }
        }
        goto LAB_00234967;
      }
      QMetaObject::tr((QString *)local_78,&staticMetaObject,"Source file does not exist.",
                      (char *)0x0,-1);
      QFileDevicePrivate::setError((QFileDevicePrivate *)this_00,RenameError,(QString *)local_78);
    }
    if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
      }
    }
  }
  uVar12 = 0;
LAB_00234967:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar12 & 0xffffff01;
}

Assistant:

bool
QFile::rename(const QString &newName)
{
    Q_D(QFile);

    // if this is a QTemporaryFile, the virtual fileName() call here may do something
    if (fileName().isEmpty()) {
        qWarning("QFile::rename: Empty or null file name");
        return false;
    }
    if (d->fileName == newName) {
        d->setError(QFile::RenameError, tr("Destination file is the same file."));
        return false;
    }
    if (!exists()) {
        d->setError(QFile::RenameError, tr("Source file does not exist."));
        return false;
    }

    // If the file exists and it is a case-changing rename ("foo" -> "Foo"),
    // compare Ids to make sure it really is a different file.
    // Note: this does not take file engines into account.
    bool changingCase = false;
    QByteArray targetId = QFileSystemEngine::id(QFileSystemEntry(newName));
    if (!targetId.isNull()) {
        QByteArray fileId = d->fileEngine ?
                    d->fileEngine->id() :
                    QFileSystemEngine::id(QFileSystemEntry(d->fileName));
        changingCase = (fileId == targetId && d->fileName.compare(newName, Qt::CaseInsensitive) == 0);
        if (!changingCase) {
            d->setError(QFile::RenameError, tr("Destination file exists"));
            return false;
        }

#if defined(Q_OS_LINUX) && QT_CONFIG(temporaryfile)
        // rename() on Linux simply does nothing when renaming "foo" to "Foo" on a case-insensitive
        // FS, such as FAT32. Move the file away and rename in 2 steps to work around.
        QTemporaryFileName tfn(d->fileName);
        QFileSystemEntry src(d->fileName);
        QSystemError error;
        for (int attempt = 0; attempt < 16; ++attempt) {
            QFileSystemEntry tmp(tfn.generateNext(), QFileSystemEntry::FromNativePath());

            // rename to temporary name
            if (!QFileSystemEngine::renameFile(src, tmp, error))
                continue;

            // rename to final name
            if (QFileSystemEngine::renameFile(tmp, QFileSystemEntry(newName), error)) {
                d->fileEngine->setFileName(newName);
                d->fileName = newName;
                return true;
            }

            // We need to restore the original file.
            QSystemError error2;
            if (QFileSystemEngine::renameFile(tmp, src, error2))
                break;      // report the original error, below

            // report both errors
            d->setError(QFile::RenameError,
                        tr("Error while renaming: %1").arg(error.toString())
                        + u'\n'
                        + tr("Unable to restore from %1: %2").
                        arg(QDir::toNativeSeparators(tmp.filePath()), error2.toString()));
            return false;
        }
        d->setError(QFile::RenameError,
                    tr("Error while renaming: %1").arg(error.toString()));
        return false;
#endif // Q_OS_LINUX
    }
    unsetError();
    close();
    if (error() == QFile::NoError) {
        if (changingCase ? d->engine()->renameOverwrite(newName) : d->engine()->rename(newName)) {
            unsetError();
            // engine was able to handle the new name so we just reset it
            d->fileEngine->setFileName(newName);
            d->fileName = newName;
            return true;
        }

        // Engine was unable to rename and the fallback will delete the original file,
        // so we have to back out here on case-insensitive file systems:
        if (changingCase) {
            d->setError(QFile::RenameError, d->fileEngine->errorString());
            return false;
        }

        if (isSequential()) {
            d->setError(QFile::RenameError, tr("Will not rename sequential file using block copy"));
            return false;
        }

#if QT_CONFIG(temporaryfile)
        // copy the file to the destination first
        if (d->copy(newName)) {
            // succeeded, remove the original
            if (!remove()) {
                d->setError(QFile::RenameError, tr("Cannot remove source file: %1").arg(errorString()));
                QFile out(newName);
                // set it back to writable so we can delete it
                out.setPermissions(ReadUser | WriteUser);
                out.remove(newName);
                return false;
            }
            d->fileEngine->setFileName(newName);
            unsetError();
            setFileName(newName);
            return true;
        } else {
            // change the error type but keep the string
            d->setError(QFile::RenameError, errorString());
        }
#else
        // copy the error from the engine rename() above
        d->setError(QFile::RenameError, d->fileEngine->errorString());
#endif
    }
    return false;
}